

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall soplex::SPxSolverBase<double>::~SPxSolverBase(SPxSolverBase<double> *this)

{
  int *piVar1;
  pointer pdVar2;
  Nonzero<double> *pNVar3;
  pointer pUVar4;
  VarStatus *pVVar5;
  
  (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__SPxSolverBase_003aed80;
  (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__SPxSolverBase_003af240;
  (this->super_SPxBasisBase<double>)._vptr_SPxBasisBase = (_func_int **)&DAT_003af260;
  if (this->freePricer == true) {
    if (this->thepricer != (SPxPricer<double> *)0x0) {
      (*this->thepricer->_vptr_SPxPricer[0x15])();
    }
    this->thepricer = (SPxPricer<double> *)0x0;
  }
  if (this->freeRatioTester == true) {
    if (this->theratiotester != (SPxRatioTester<double> *)0x0) {
      (*this->theratiotester->_vptr_SPxRatioTester[0xb])();
    }
    this->theratiotester = (SPxRatioTester<double> *)0x0;
  }
  if (this->freeStarter == true) {
    if (this->thestarter != (SPxStarter<double> *)0x0) {
      (*this->thestarter->_vptr_SPxStarter[1])();
    }
    this->thestarter = (SPxStarter<double> *)0x0;
  }
  (**this->theTime->_vptr_Timer)();
  (**this->multTimeSparse->_vptr_Timer)();
  (**this->multTimeFull->_vptr_Timer)();
  (**this->multTimeColwise->_vptr_Timer)();
  (**this->multTimeUnsetup->_vptr_Timer)();
  free(this->theTime);
  this->theTime = (Timer *)0x0;
  free(this->multTimeSparse);
  this->multTimeSparse = (Timer *)0x0;
  free(this->multTimeFull);
  this->multTimeFull = (Timer *)0x0;
  free(this->multTimeColwise);
  this->multTimeColwise = (Timer *)0x0;
  free(this->multTimeUnsetup);
  this->multTimeUnsetup = (Timer *)0x0;
  piVar1 = (this->integerVariables).data;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->integerVariables).data = (int *)0x0;
  }
  pdVar2 = (this->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->coWeights).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pdVar2 = (this->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->weights).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  piVar1 = (this->isInfeasibleCo).data;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->isInfeasibleCo).data = (int *)0x0;
  }
  piVar1 = (this->isInfeasible).data;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->isInfeasible).data = (int *)0x0;
  }
  DIdxSet::~DIdxSet(&this->updateViolsCo);
  DIdxSet::~DIdxSet(&this->updateViols);
  DIdxSet::~DIdxSet(&this->infeasibilitiesCo);
  DIdxSet::~DIdxSet(&this->infeasibilities);
  (this->dualFarkas)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
  pNVar3 = (this->dualFarkas).theelem;
  if (pNVar3 != (Nonzero<double> *)0x0) {
    free(pNVar3);
    (this->dualFarkas).theelem = (Nonzero<double> *)0x0;
  }
  (this->primalRay)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
  pNVar3 = (this->primalRay).theelem;
  if (pNVar3 != (Nonzero<double> *)0x0) {
    free(pNVar3);
    (this->primalRay).theelem = (Nonzero<double> *)0x0;
  }
  pdVar2 = (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->theTest).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pdVar2 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->theCoTest).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pdVar2 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->theLBbound).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pdVar2 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->theUBbound).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pdVar2 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->theLCbound).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pdVar2 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->theUCbound).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pdVar2 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->theLRbound).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pdVar2 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->theURbound).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  UpdateVector<double>::~UpdateVector(&this->addVec);
  UpdateVector<double>::~UpdateVector(&this->dualVec);
  pdVar2 = (this->dualRhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->dualRhs).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  UpdateVector<double>::~UpdateVector(&this->primVec);
  pdVar2 = (this->primRhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->primRhs).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pUVar4 = (this->unitVecs).data.
           super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pUVar4 != (pointer)0x0) {
    operator_delete(pUVar4,(long)(this->unitVecs).data.
                                 super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pUVar4);
  }
  pVVar5 = (this->oldBasisStatusCols).data;
  if (pVVar5 != (VarStatus *)0x0) {
    free(pVVar5);
    (this->oldBasisStatusCols).data = (VarStatus *)0x0;
  }
  pVVar5 = (this->oldBasisStatusRows).data;
  if (pVVar5 != (VarStatus *)0x0) {
    free(pVVar5);
    (this->oldBasisStatusRows).data = (VarStatus *)0x0;
  }
  SPxBasisBase<double>::~SPxBasisBase(&this->super_SPxBasisBase<double>);
  SPxLPBase<double>::~SPxLPBase(&this->super_SPxLPBase<double>);
  return;
}

Assistant:

SPxSolverBase<R>::~SPxSolverBase()
   {
      assert(!freePricer || thepricer != nullptr);
      assert(!freeRatioTester || theratiotester != nullptr);
      assert(!freeStarter || thestarter != nullptr);

      if(freePricer)
      {
         delete thepricer;
         thepricer = nullptr;
      }

      if(freeRatioTester)
      {
         delete theratiotester;
         theratiotester = nullptr;
      }

      if(freeStarter)
      {
         delete thestarter;
         thestarter = nullptr;
      }

      // free the timers
      assert(theTime);
      assert(multTimeSparse);
      assert(multTimeFull);
      assert(multTimeColwise);
      assert(multTimeUnsetup);
      theTime->~Timer();
      multTimeSparse->~Timer();
      multTimeFull->~Timer();
      multTimeColwise->~Timer();
      multTimeUnsetup->~Timer();
      spx_free(theTime);
      spx_free(multTimeSparse);
      spx_free(multTimeFull);
      spx_free(multTimeColwise);
      spx_free(multTimeUnsetup);
   }